

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderReturnTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::ShaderReturnTests::init(ShaderReturnTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  long *plVar3;
  TestNode *pTVar4;
  undefined8 extraout_RAX;
  undefined8 uVar5;
  long *plVar6;
  ulong uVar7;
  char *pcVar8;
  ReturnMode RVar9;
  bool bVar10;
  bool bVar11;
  string description;
  string name;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  TestNode *local_78;
  ulong local_70;
  char *local_68;
  char *local_60;
  uint local_54;
  long *local_50 [2];
  long local_40 [2];
  
  pTVar2 = (TestNode *)operator_new(0x128);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar2,(this->super_TestCaseGroup).m_context,"single_return_vertex"
             ,"Single return statement in function",true,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_coords;\nout highp vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
             ,evalReturnAlways);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x128);
  RVar9 = RETURNMODE_ALWAYS;
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "single_return_fragment","Single return statement in function",false,
             "#version 300 es\nin mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    o_color = getColor();\n}\n"
             ,evalReturnAlways);
  local_78 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = local_78;
  do {
    bVar11 = true;
    do {
      local_f8 = &local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"conditional_return_","");
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_c8 = *plVar6;
        lStack_c0 = plVar3[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar6;
        local_d8 = (long *)*plVar3;
      }
      local_d0 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_b8 = &local_a8;
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_a8 = *plVar6;
        lStack_a0 = plVar3[3];
      }
      else {
        local_a8 = *plVar6;
        local_b8 = (long *)*plVar3;
      }
      local_b0 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (RVar9 < RETURNMODE_LAST) {
        pcVar8 = (&PTR_anon_var_dwarf_1c8e677_0213ca08)[RVar9];
      }
      else {
        pcVar8 = (char *)0x0;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,pcVar8,(allocator<char> *)&local_98);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_c8 = *plVar6;
        lStack_c0 = plVar3[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar6;
        local_d8 = (long *)*plVar3;
      }
      local_d0 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      pTVar4 = (TestNode *)
               makeConditionalReturnInFuncCase
                         ((Context *)pTVar2[1]._vptr_TestNode,(char *)local_b8,(char *)local_d8,
                          RVar9,bVar11);
      tcu::TestNode::addChild(pTVar2,pTVar4);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      bVar10 = bVar11 != false;
      bVar11 = false;
    } while (bVar10);
    RVar9 = RVar9 + RETURNMODE_NEVER;
  } while (RVar9 != RETURNMODE_LAST);
  pTVar4 = (TestNode *)operator_new(0x128);
  pTVar2 = local_78;
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar4,(Context *)local_78[1]._vptr_TestNode,"double_return_vertex"
             ,"Unconditional double return in function",true,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_coords;\nout highp vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n    return vec4(a_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
             ,evalReturnAlways);
  tcu::TestNode::addChild(pTVar2,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x128);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar4,(Context *)pTVar2[1]._vptr_TestNode,"double_return_fragment"
             ,"Unconditional double return in function",false,
             "#version 300 es\nin mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\n\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n    return vec4(v_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    o_color = getColor();\n}\n"
             ,evalReturnAlways);
  tcu::TestNode::addChild(pTVar2,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x128);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar4,(Context *)pTVar2[1]._vptr_TestNode,
             "last_statement_in_main_vertex","Return as a final statement in main()",true,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_coords;\nout highp vec4 v_color;\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(a_coords.xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways);
  tcu::TestNode::addChild(pTVar2,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x128);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar4,(Context *)pTVar2[1]._vptr_TestNode,
             "last_statement_in_main_fragment","Return as a final statement in main()",false,
             "#version 300 es\nin mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\n\nvoid main (void)\n{\n    o_color = vec4(v_coords.xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways);
  tcu::TestNode::addChild(pTVar2,pTVar4);
  pTVar2 = local_78;
  uVar5 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  uVar7 = 0;
  do {
    local_54 = (uint)uVar5;
    bVar11 = (uVar7 & 1) != 0;
    local_60 = "";
    if (bVar11) {
      local_60 = "in_func_";
    }
    local_68 = " in main()";
    if (bVar11) {
      local_68 = " in user-defined function";
    }
    RVar9 = RETURNMODE_ALWAYS;
    local_70 = uVar7;
    do {
      bVar11 = true;
      do {
        local_98 = &local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"output_write_","");
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_f8 = &local_e8;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_e8 = *plVar6;
          lStack_e0 = plVar3[3];
        }
        else {
          local_e8 = *plVar6;
          local_f8 = (long *)*plVar3;
        }
        local_f0 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_c8 = *plVar6;
          lStack_c0 = plVar3[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *plVar6;
          local_d8 = (long *)*plVar3;
        }
        local_d0 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_b8 = &local_a8;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_a8 = *plVar6;
          lStack_a0 = plVar3[3];
        }
        else {
          local_a8 = *plVar6;
          local_b8 = (long *)*plVar3;
        }
        local_b0 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if (RVar9 < RETURNMODE_LAST) {
          pcVar8 = (&PTR_anon_var_dwarf_1c8e677_0213ca08)[RVar9];
        }
        else {
          pcVar8 = (char *)0x0;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,pcVar8,(allocator<char> *)local_50);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_f8 = &local_e8;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_e8 = *plVar6;
          lStack_e0 = plVar3[3];
        }
        else {
          local_e8 = *plVar6;
          local_f8 = (long *)*plVar3;
        }
        local_f0 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_c8 = *plVar6;
          lStack_c0 = plVar3[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *plVar6;
          local_d8 = (long *)*plVar3;
        }
        local_d0 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        uVar5 = 0;
        pTVar4 = (TestNode *)
                 makeOutputWriteReturnCase
                           ((Context *)pTVar2[1]._vptr_TestNode,(char *)local_b8,(char *)local_d8,
                            (bool)((byte)local_70 & 1),RVar9,bVar11);
        tcu::TestNode::addChild(pTVar2,pTVar4);
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        bVar10 = bVar11 != false;
        bVar11 = false;
      } while (bVar10);
      RVar9 = RVar9 + RETURNMODE_NEVER;
    } while (RVar9 != RETURNMODE_LAST);
    uVar7 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
    uVar5 = 0;
  } while ((local_54 & 1) != 0);
  uVar1 = 1;
  uVar5 = 0;
  do {
    local_70 = CONCAT44(local_70._4_4_,uVar1);
    local_60 = "static";
    if ((char)uVar5 != '\0') {
      local_60 = "dynamic";
    }
    RVar9 = RETURNMODE_ALWAYS;
    local_68 = (char *)uVar5;
    do {
      bVar11 = true;
      do {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"return_in_","");
        plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
        local_98 = &local_88;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_88 = *plVar6;
          lStack_80 = plVar3[3];
        }
        else {
          local_88 = *plVar6;
          local_98 = (long *)*plVar3;
        }
        local_90 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_f8 = &local_e8;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_e8 = *plVar6;
          lStack_e0 = plVar3[3];
        }
        else {
          local_e8 = *plVar6;
          local_f8 = (long *)*plVar3;
        }
        local_f0 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_c8 = *plVar6;
          lStack_c0 = plVar3[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *plVar6;
          local_d8 = (long *)*plVar3;
        }
        local_d0 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_b8 = &local_a8;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_a8 = *plVar6;
          lStack_a0 = plVar3[3];
        }
        else {
          local_a8 = *plVar6;
          local_b8 = (long *)*plVar3;
        }
        local_b0 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if (RVar9 < RETURNMODE_LAST) {
          pcVar8 = (&PTR_anon_var_dwarf_1c8e677_0213ca08)[RVar9];
        }
        else {
          pcVar8 = (char *)0x0;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,pcVar8,(allocator<char> *)&local_98);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_c8 = *plVar6;
          lStack_c0 = plVar3[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *plVar6;
          local_d8 = (long *)*plVar3;
        }
        local_d0 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        pTVar2 = local_78;
        uVar5 = 0;
        pTVar4 = (TestNode *)
                 makeReturnInLoopCase
                           ((Context *)local_78[1]._vptr_TestNode,(char *)local_b8,(char *)local_d8,
                            (bool)((byte)local_68 & 1),RVar9,bVar11);
        tcu::TestNode::addChild(pTVar2,pTVar4);
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        bVar10 = bVar11 != false;
        bVar11 = false;
      } while (bVar10);
      RVar9 = RVar9 + RETURNMODE_NEVER;
    } while (RVar9 != RETURNMODE_LAST);
    uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
    uVar1 = 0;
  } while ((local_70 & 1) != 0);
  pTVar4 = (TestNode *)operator_new(0x128);
  pTVar2 = local_78;
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar4,(Context *)local_78[1]._vptr_TestNode,
             "return_in_infinite_loop_vertex","Return in infinite loop",true,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_coords;\nout highp vec4 v_color;\nuniform int ui_zero;\n\nhighp vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn a_coords;\n\treturn a_coords.wzyx;\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways);
  tcu::TestNode::addChild(pTVar2,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x128);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar4,(Context *)pTVar2[1]._vptr_TestNode,
             "return_in_infinite_loop_fragment","Return in infinite loop",false,
             "#version 300 es\nin mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\nuniform int ui_zero;\n\nmediump vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn v_coords;\n\treturn v_coords.wzyx;\n}\n\nvoid main (void)\n{\n    o_color = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways);
  tcu::TestNode::addChild(pTVar2,pTVar4);
  return extraout_EAX;
}

Assistant:

void ShaderReturnTests::init (void)
{
	// Single return statement in function.
	addChild(new ShaderReturnCase(m_context, "single_return_vertex", "Single return statement in function", true,
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"in highp vec4 a_coords;\n"
		"out highp vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "single_return_fragment", "Single return statement in function", false,
		"#version 300 es\n"
		"in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = getColor();\n"
		"}\n", evalReturnAlways));

	// Conditional return statement in function.
	for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
	{
		for (int isFragment = 0; isFragment < 2; isFragment++)
		{
			string name			= string("conditional_return_") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
			string description	= string(getReturnModeDesc((ReturnMode)returnMode)) + " in function";
			addChild(makeConditionalReturnInFuncCase(m_context, name.c_str(), description.c_str(), (ReturnMode)returnMode, isFragment == 0));
		}
	}

	// Unconditional double return in function.
	addChild(new ShaderReturnCase(m_context, "double_return_vertex", "Unconditional double return in function", true,
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"in highp vec4 a_coords;\n"
		"out highp vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"    return vec4(a_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "double_return_fragment", "Unconditional double return in function", false,
		"#version 300 es\n"
		"in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"    return vec4(v_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = getColor();\n"
		"}\n", evalReturnAlways));

	// Last statement in main.
	addChild(new ShaderReturnCase(m_context, "last_statement_in_main_vertex", "Return as a final statement in main()", true,
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"in highp vec4 a_coords;\n"
		"out highp vec4 v_color;\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(a_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "last_statement_in_main_fragment", "Return as a final statement in main()", false,
		"#version 300 es\n"
		"in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = vec4(v_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways));

	// Return between output variable writes.
	for (int inFunc = 0; inFunc < 2; inFunc++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				string name = string("output_write_") + (inFunc ? "in_func_" : "") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				string desc = string(getReturnModeDesc((ReturnMode)returnMode)) + (inFunc ? " in user-defined function" : " in main()") + " between output writes";

				addChild(makeOutputWriteReturnCase(m_context, name.c_str(), desc.c_str(), inFunc != 0, (ReturnMode)returnMode, isFragment == 0));
			}
		}
	}

	// Conditional return statement in loop.
	for (int isDynamicLoop = 0; isDynamicLoop < 2; isDynamicLoop++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				string name			= string("return_in_") + (isDynamicLoop ? "dynamic" : "static") + "_loop_" + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				string description	= string(getReturnModeDesc((ReturnMode)returnMode)) + " in loop";
				addChild(makeReturnInLoopCase(m_context, name.c_str(), description.c_str(), isDynamicLoop != 0, (ReturnMode)returnMode, isFragment == 0));
			}
		}
	}

	// Unconditional return in infinite loop.
	addChild(new ShaderReturnCase(m_context, "return_in_infinite_loop_vertex", "Return in infinite loop", true,
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"in highp vec4 a_coords;\n"
		"out highp vec4 v_color;\n"
		"uniform int ui_zero;\n\n"
		"highp vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return a_coords;\n"
		"	return a_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "return_in_infinite_loop_fragment", "Return in infinite loop", false,
		"#version 300 es\n"
		"in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"uniform int ui_zero;\n\n"
		"mediump vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return v_coords;\n"
		"	return v_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways));
}